

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void bit_move_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  anon_union_16_7_685e5830_for_cs_m680x_op_1 *paVar2;
  uint16_t *in_RDX;
  m680x_info *in_RSI;
  cs_m680x_op *op;
  cs_m680x *m680x;
  uint8_t post_byte;
  m680x_info *info_00;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar3;
  
  bVar3 = 0;
  info_00 = (m680x_info *)&in_RSI->m680x;
  read_byte(in_RSI,&stack0xffffffffffffffe7,*in_RDX);
  *in_RDX = *in_RDX + 1;
  add_reg_operand(in_RSI,bit_move_hdlr::m680x_reg[(int)(uint)bVar3 >> 6]);
  bVar1 = *(byte *)((long)&info_00->code + 1);
  *(byte *)((long)&info_00->code + 1) = bVar1 + 1;
  paVar2 = &(info_00->m680x).operands[(ulong)bVar1 - 1].field_1;
  paVar2->imm = 7;
  *(byte *)(&paVar2->imm + 1) = (byte)((int)(uint)bVar3 >> 3) & 7;
  bVar1 = *(byte *)((long)&info_00->code + 1);
  *(byte *)((long)&info_00->code + 1) = bVar1 + 1;
  paVar2 = &(info_00->m680x).operands[(ulong)bVar1 - 1].field_1;
  paVar2->imm = 7;
  *(byte *)((long)paVar2 + 4) = bVar3 & 7;
  direct_hdlr((MCInst *)CONCAT17(bVar3,in_stack_ffffffffffffffe0),info_00,(uint16_t *)&paVar2->reg);
  return;
}

Assistant:

static void bit_move_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	static const m680x_reg m680x_reg[] = {
		M680X_REG_CC, M680X_REG_A, M680X_REG_B, M680X_REG_INVALID,
	};

	uint8_t post_byte = 0;
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op;

	read_byte(info, &post_byte, *address);
	(*address)++;

	// operand[0] = register
	add_reg_operand(info, m680x_reg[post_byte >> 6]);

	// operand[1] = bit index in source operand
	op = &m680x->operands[m680x->op_count++];
	op->type = M680X_OP_CONSTANT;
	op->const_val = (post_byte >> 3) & 0x07;

	// operand[2] = bit index in destination operand
	op = &m680x->operands[m680x->op_count++];
	op->type = M680X_OP_CONSTANT;
	op->const_val = post_byte & 0x07;

	direct_hdlr(MI, info, address);
}